

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O2

void * mwTestMem(void *p,uint len,int c)

{
  uchar *ptr;
  bool bVar1;
  
  while( true ) {
    bVar1 = len == 0;
    len = len - 1;
    if (bVar1) {
      return (void *)0x0;
    }
    if (*p != (char)c) break;
    p = (void *)((long)p + 1);
  }
  return (char *)p;
}

Assistant:

static const void *mwTestMem(const void *p, unsigned len, int c)
{
	const unsigned char *ptr;
	ptr = (const unsigned char *) p;
	while (len--) {
		if (*ptr != (unsigned char)c) {
			return (const void *)ptr;
		}
		ptr ++;
	}
	return NULL;
}